

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::find_lower(StringRef *this,StringRef Str,size_t From)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  undefined1 local_108 [8];
  StringRef This;
  size_t From_local;
  StringRef *this_local;
  StringRef Str_local;
  unsigned_long local_c0 [2];
  size_t local_b0;
  StringRef *local_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 *local_70;
  unsigned_long local_68 [3];
  undefined1 *local_50;
  undefined1 local_48 [16];
  char *local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  local_c0[1] = 0xffffffffffffffff;
  This.Length = From;
  local_b0 = From;
  local_a8 = this;
  puVar2 = std::min<unsigned_long>(&local_b0,&this->Length);
  local_b0 = *puVar2;
  pcVar3 = this->Data + local_b0;
  local_c0[0] = this->Length - local_b0;
  puVar2 = std::min<unsigned_long>(local_c0 + 1,local_c0);
  This.Data = (char *)*puVar2;
  local_10 = local_a0;
  local_108 = (undefined1  [8])pcVar3;
  local_20 = This.Data;
  local_18 = pcVar3;
  while( true ) {
    if (This.Data < (char *)Str.Length) {
      return 0xffffffffffffffff;
    }
    bVar1 = startswith_lower((StringRef *)local_108,Str);
    if (bVar1) break;
    local_88 = local_108;
    local_90 = 1;
    local_70 = local_88;
    if (This.Data == (char *)0x0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    local_68[2] = 1;
    local_68[1] = 0xffffffffffffffff;
    local_50 = local_88;
    puVar2 = std::min<unsigned_long>(local_68 + 2,(unsigned_long *)&This);
    local_68[2] = *puVar2;
    pcVar3 = (char *)((long)local_108 + local_68[2]);
    local_68[0] = (long)This.Data - local_68[2];
    puVar2 = std::min<unsigned_long>(local_68 + 1,local_68);
    This.Data = (char *)*puVar2;
    local_28 = local_48;
    This.Length = This.Length + 1;
    local_108 = (undefined1  [8])pcVar3;
    local_38 = This.Data;
    local_30 = pcVar3;
  }
  return This.Length;
}

Assistant:

size_t StringRef::find_lower(StringRef Str, size_t From) const {
  StringRef This = substr(From);
  while (This.size() >= Str.size()) {
    if (This.startswith_lower(Str))
      return From;
    This = This.drop_front();
    ++From;
  }
  return npos;
}